

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O2

void __thiscall
AmsRouter::AwaitConnectionAttempts
          (AmsRouter *this,AmsNetId *ams,unique_lock<std::recursive_mutex> *lock)

{
  iterator iVar1;
  
  while( true ) {
    iVar1 = std::
            _Rb_tree<AmsNetId,_std::pair<const_AmsNetId,_std::tuple<>_>,_std::_Select1st<std::pair<const_AmsNetId,_std::tuple<>_>_>,_std::less<AmsNetId>,_std::allocator<std::pair<const_AmsNetId,_std::tuple<>_>_>_>
            ::find(&(this->connection_attempts)._M_t,ams);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->connection_attempts)._M_t._M_impl.super__Rb_tree_header) break;
    std::_V2::condition_variable_any::wait<std::unique_lock<std::recursive_mutex>>
              (&this->connection_attempt_events,lock);
  }
  return;
}

Assistant:

void AmsRouter::AwaitConnectionAttempts(const AmsNetId& ams, std::unique_lock<std::recursive_mutex>& lock)
{
    connection_attempt_events.wait(lock, [&]() { return connection_attempts.find(ams) == connection_attempts.end(); });
}